

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf_utilities.cpp
# Opt level: O2

Matrix3d * ins_ekf::SkewSymmetric(Matrix3d *__return_storage_ptr__,Vector3d *vect)

{
  double *s;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar1;
  Scalar local_60;
  Scalar local_58;
  double local_50;
  Scalar local_48;
  double local_40;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_38;
  
  local_38.m_row = 0;
  local_38.m_col = 1;
  local_38.m_currentBlockRows = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = 0.0;
  local_40 = -(vect->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2];
  local_38.m_xpr = __return_storage_ptr__;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_38,&local_40);
  s = (vect->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
      1;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,s);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,(vect->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                             m_storage.m_data.array + 2);
  local_48 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_48);
  local_50 = -(vect->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_50);
  local_58 = -*s;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_58);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,(Scalar *)vect);
  local_60 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&local_60);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d SkewSymmetric(const Eigen::Vector3d& vect){

        Eigen::Matrix3d ss;
        ss << 0, -vect[2], vect[1],
                vect[2], 0, -vect[0],
                -vect[1], vect[0], 0;
        return ss;
    }